

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::feastol(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *__return_storage_ptr__,
         SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Real a;
  
  this_00 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::floatingPointFeastol(this_00);
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x11] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x12] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x13] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x14] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x15] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x16] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x17] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x18] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x19] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1a] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return __return_storage_ptr__;
}

Assistant:

R feastol() const
   {
      return this->tolerances()->floatingPointFeastol();
   }